

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase146::run(TestCase146 *this)

{
  Reader reader;
  long *plVar1;
  undefined8 uVar2;
  RequestHook *pRVar3;
  PipelineOp *pPVar4;
  ArrayDisposer *pAVar5;
  CapTableBuilder *pCVar6;
  WirePointer *pWVar7;
  PipelineHook *pPVar8;
  size_t sVar9;
  PromiseNode *pPVar10;
  Event *pEVar11;
  Server *pSVar12;
  AsyncIoStream *pAVar13;
  AsyncIoProvider *pAVar14;
  int iVar15;
  TransformPromiseNodeBase *this_00;
  EventLoop *pEVar16;
  EventLoop *pEVar17;
  EventLoop *pEVar18;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *extraout_RDX_12;
  void *extraout_RDX_13;
  void *pvVar19;
  void *extraout_RDX_14;
  void *extraout_RDX_15;
  void *extraout_RDX_16;
  void *extraout_RDX_17;
  void *extraout_RDX_18;
  void *extraout_RDX_19;
  void *extraout_RDX_20;
  void *extraout_RDX_21;
  void *extraout_RDX_22;
  void *pvVar20;
  int __flags;
  Event **ppEVar21;
  Disposer *pDVar22;
  Client CVar23;
  Own<capnp::ClientHook> OVar24;
  Reader RVar25;
  ReaderOptions receiveOptions;
  bool disconnected;
  int callCount;
  int reverseCallCount;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  Promise<void> disconnectPromise;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  Client client;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int handleCount;
  TwoPartyVatNetwork network;
  char local_5f1;
  int local_5f0;
  int local_5ec;
  ArrayPtr<const_char> local_5e8;
  long *local_5d8;
  undefined1 local_5d0 [16];
  EventLoop *pEStack_5c0;
  EventLoop *pEStack_5b8;
  Event *pEStack_5b0;
  Disposer *local_5a8;
  RequestHook *local_5a0;
  long *local_598;
  undefined1 local_590 [32];
  PipelineOp *local_570;
  Disposer *pDStack_568;
  ArrayDisposer *local_560;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_558;
  undefined1 local_520 [16];
  Pipeline local_510;
  Own<kj::_::PromiseNode> local_4e8;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_4d8;
  undefined1 local_4a0 [32];
  Event *pEStack_480;
  Disposer *local_478;
  RequestHook *local_470;
  undefined1 local_468 [32];
  Event *pEStack_448;
  Disposer *local_440;
  RequestHook *local_438;
  undefined1 local_430 [16];
  Server *pSStack_420;
  PipeThread local_418;
  undefined8 *local_3f8;
  long *local_3f0;
  undefined8 *local_3e8;
  AsyncIoProvider *local_3e0;
  WaitScope *local_3d8;
  undefined1 local_3c8 [368];
  RpcSystemBase local_258;
  int local_244;
  Maybe<capnp::MessageSize> local_240;
  Maybe<capnp::MessageSize> local_228;
  Maybe<capnp::MessageSize> local_210;
  Maybe<capnp::MessageSize> local_1f8;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  TwoPartyVatNetwork local_1b0;
  
  kj::setupAsyncIo();
  local_5f0 = 0;
  local_244 = 0;
  local_5ec = 0;
  runServer(&local_418,local_3e0,&local_5f0,&local_244);
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  __flags = 0x40;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&local_1b0,local_418.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&local_258,&local_1b0.super_TwoPartyVatNetworkBase);
  local_5f1 = '\0';
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_3c8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_3c8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:157:69),_kj::_::PropagateException>
             ::anon_class_8_1_ce360c39_for_func::operator());
  uVar2 = local_3c8._8_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00634920;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_5f1;
  local_4e8.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase146::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_4e8.ptr = (PromiseNode *)this_00;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  CVar23 = getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)local_5d0,(Side)&local_258,
                            TEST_PIPELINE);
  (*((BootstrapFactoryBase *)local_5d0._8_8_)->_vptr_BootstrapFactoryBase[4])
            (local_3c8,local_5d0._8_8_,CVar23.hook.ptr);
  uVar2 = local_5d0._8_8_;
  local_430._8_4_ = local_3c8._0_4_;
  local_430._12_4_ = local_3c8._4_4_;
  pSStack_420 = (Server *)local_3c8._8_8_;
  local_430._0_8_ = &capnproto_test::capnp::test::TestPipeline::Client::typeinfo;
  if ((Impl *)local_5d0._8_8_ != (Impl *)0x0) {
    local_5d0._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_5d0._0_8_)->arena->_vptr_Arena)
              (local_5d0._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  local_1c8.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_520,(Client *)local_430,&local_1c8);
  *(undefined4 *)&(local_510.hook.disposer)->_vptr_Disposer = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_590,&local_5ec);
  pEVar16 = (EventLoop *)local_590._8_8_;
  local_3c8._0_8_ = local_590._0_8_;
  local_3c8._8_8_ = local_590._8_8_ + 0x10;
  if ((EventLoop *)local_590._8_8_ == (EventLoop *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
  }
  local_590._8_8_ = (EventLoop *)0x0;
  OVar24 = Capability::Client::makeLocalClient
                     ((Client *)(local_5d0 + 8),(Own<capnp::Capability::Server> *)local_3c8);
  uVar2 = local_3c8._8_8_;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(Event **)uVar2)[-1].prev),OVar24.ptr);
  }
  local_5d0._0_8_ = &Capability::Client::typeinfo;
  local_3c8._0_8_ = local_520._0_8_;
  local_3c8._8_8_ = local_520._8_8_;
  local_3c8._16_8_ = local_510.hook.ptr;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_3c8,(Own<capnp::ClientHook> *)(local_5d0 + 8));
  pEVar18 = pEStack_5c0;
  pvVar19 = extraout_RDX;
  if (pEStack_5c0 != (EventLoop *)0x0) {
    pEStack_5c0 = (EventLoop *)0x0;
    (**((BootstrapFactoryBase *)local_5d0._8_8_)->_vptr_BootstrapFactoryBase)
              (local_5d0._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)&pEVar18->port)->value +
               *(long *)((long)*(WirePointer *)pEVar18 + -0x10));
    pvVar19 = extraout_RDX_00;
  }
  uVar2 = local_590._8_8_;
  if ((EventLoop *)local_590._8_8_ != (EventLoop *)0x0) {
    local_590._8_8_ = (EventLoop *)0x0;
    (*(code *)((SegmentReader *)local_590._0_8_)->arena->_vptr_Arena)
              (local_590._0_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
    pvVar19 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)local_590,(int)local_520,pvVar19,(size_t)pEVar16,__flags);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,(Pipeline *)(local_590 + 0x10),1);
  local_5d0._0_8_ = local_3c8._0_8_;
  local_5d0._8_8_ = local_3c8._8_8_;
  pEStack_5c0 = (EventLoop *)local_3c8._16_8_;
  pEStack_5b8 = (EventLoop *)local_3c8._24_8_;
  pEStack_5b0 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_558,(Pipeline *)local_5d0);
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_468,(Client *)&local_558,&local_1e0);
  pvVar19 = local_558.super_Builder._builder.data;
  pvVar20 = extraout_RDX_02;
  if ((long *)local_558.super_Builder._builder.data != (long *)0x0) {
    local_558.super_Builder._builder.data = (long *)0x0;
    (**((local_558.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_558.super_Builder._builder.capTable,(long)pvVar19 + *(long *)(*pvVar19 + -0x10)
              );
    pvVar20 = extraout_RDX_03;
  }
  pEVar17 = pEStack_5b8;
  pEVar18 = pEStack_5c0;
  if (pEStack_5c0 != (EventLoop *)0x0) {
    pEStack_5c0 = (EventLoop *)0x0;
    pEStack_5b8 = (EventLoop *)0x0;
    pEVar16 = pEVar17;
    (**pEStack_5b0->_vptr_Event)(pEStack_5b0,pEVar18,8,pEVar17,pEVar17,0);
    __flags = (int)pEVar16;
    pEVar16 = pEVar17;
    pvVar20 = extraout_RDX_04;
  }
  uVar2 = local_5d0._8_8_;
  if ((Impl *)local_5d0._8_8_ != (Impl *)0x0) {
    local_5d0._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_5d0._0_8_)->arena->_vptr_Arena)
              (local_5d0._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar20 = extraout_RDX_05;
  }
  *(Type *)local_468._16_8_ = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_558,(int)local_468,pvVar20,(size_t)pEVar16,__flags);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,(Pipeline *)(local_590 + 0x10),1);
  local_5d0._0_8_ = local_3c8._0_8_;
  local_5d0._8_8_ = local_3c8._8_8_;
  pEStack_5c0 = (EventLoop *)local_3c8._16_8_;
  pEStack_5b8 = (EventLoop *)local_3c8._24_8_;
  pEStack_5b0 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_5e8,(Pipeline *)local_5d0);
  (**(code **)(**(long **)((long)&local_5e8.size_ + *(long *)(local_5e8.ptr + -0x18)) + 0x20))
            (local_3c8);
  local_4d8.super_Builder._builder.capTable = (CapTableBuilder *)local_3c8._0_8_;
  local_4d8.super_Builder._builder.data = (void *)local_3c8._8_8_;
  local_4d8.super_Builder._builder.segment =
       (SegmentBuilder *)&capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_1f8.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_4a0,(Client *)&local_4d8,&local_1f8);
  pvVar19 = local_4d8.super_Builder._builder.data;
  pvVar20 = extraout_RDX_06;
  if ((Impl *)local_4d8.super_Builder._builder.data != (Impl *)0x0) {
    local_4d8.super_Builder._builder.data = (Impl *)0x0;
    (**((local_4d8.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_4d8.super_Builder._builder.capTable,
               ((BootstrapFactoryBase *)pvVar19)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)pvVar19);
    pvVar20 = extraout_RDX_07;
  }
  plVar1 = local_5d8;
  if (local_5d8 != (long *)0x0) {
    local_5d8 = (long *)0x0;
    (*(code *)**(undefined8 **)local_5e8.size_)
              (local_5e8.size_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    pvVar20 = extraout_RDX_08;
  }
  pEVar17 = pEStack_5b8;
  pEVar18 = pEStack_5c0;
  if (pEStack_5c0 != (EventLoop *)0x0) {
    pEStack_5c0 = (EventLoop *)0x0;
    pEStack_5b8 = (EventLoop *)0x0;
    pEVar16 = pEVar17;
    (**pEStack_5b0->_vptr_Event)(pEStack_5b0,pEVar18,8,pEVar17,pEVar17,0);
    __flags = (int)pEVar16;
    pEVar16 = pEVar17;
    pvVar20 = extraout_RDX_09;
  }
  uVar2 = local_5d0._8_8_;
  if ((Impl *)local_5d0._8_8_ != (Impl *)0x0) {
    local_5d0._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_5d0._0_8_)->arena->_vptr_Arena)
              (local_5d0._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar20 = extraout_RDX_10;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_4d8,(int)local_4a0,pvVar20,(size_t)pEVar16,__flags);
  local_3c8._32_8_ = (Event *)0x0;
  local_3c8._40_8_ = (Event **)0x0;
  local_3c8._16_8_ = (WirePointer *)0x0;
  local_3c8._24_8_ = (EventLoop *)0x0;
  local_3c8._0_8_ = (_func_int **)0x0;
  local_3c8._8_8_ = (Impl *)0x0;
  local_3c8._48_8_ = (ArrayDisposer *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_590,
             (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_3c8);
  ppEVar21 = (Event **)local_3c8._40_8_;
  uVar2 = local_3c8._32_8_;
  if ((Event *)local_3c8._32_8_ != (Event *)0x0) {
    local_3c8._32_8_ = (Event *)0x0;
    local_3c8._40_8_ = (Event **)0x0;
    (***(_func_int ***)local_3c8._48_8_)(local_3c8._48_8_,uVar2,8,ppEVar21,ppEVar21,0);
    __flags = (int)ppEVar21;
  }
  uVar2 = local_3c8._24_8_;
  if ((EventLoop *)local_3c8._24_8_ != (EventLoop *)0x0) {
    local_3c8._24_8_ = (EventLoop *)0x0;
    (**(code **)*(WirePointer *)local_3c8._16_8_)
              (local_3c8._16_8_,
               (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort + (long)(EventPort **)uVar2);
  }
  uVar2 = local_3c8._8_8_;
  if ((Impl *)local_3c8._8_8_ != (Impl *)0x0) {
    local_3c8._8_8_ = (Impl *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  if ((local_5f0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
    __flags = 0x4c95ab;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xb6,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)local_3c8,&local_5f0);
  }
  if ((local_5ec != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
    __flags = 0x4fe02f;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xb7,ERROR,
               "\"failed: expected \" \"(0) == (reverseCallCount)\", 0, reverseCallCount",
               (char (*) [43])"failed: expected (0) == (reverseCallCount)",(int *)local_3c8,
               &local_5ec);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_3c8,&local_558);
  if (local_3c8._36_2_ == 0) {
    iVar15 = 0x7fffffff;
    local_5d0._8_8_ = (Impl *)0x0;
    pEStack_5c0 = (EventLoop *)0x0;
    local_5d0._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_5d0._8_8_ = local_3c8._8_8_;
    pEStack_5c0 = (EventLoop *)local_3c8._24_8_;
    local_5d0._0_8_ = local_3c8._0_8_;
    iVar15 = local_3c8._40_4_;
  }
  pEStack_5b8 = (EventLoop *)CONCAT44(pEStack_5b8._4_4_,iVar15);
  RVar25 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d0,(void *)0x0,0);
  if (((RVar25.super_StringPtr.content.size_ != 4) ||
      (iVar15 = bcmp(RVar25.super_StringPtr.content.ptr,"bar",3), iVar15 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3c8._36_2_ = (undefined2)((ulong)local_3c8._32_8_ >> 0x20);
    if (local_3c8._36_2_ == 0) {
      local_3c8._40_4_ = 0x7fffffff;
      local_5d0._8_8_ = (Impl *)0x0;
      pEStack_5c0 = (EventLoop *)0x0;
      local_5d0._0_8_ = (SegmentBuilder *)0x0;
    }
    else {
      local_5d0._8_8_ = local_3c8._8_8_;
      pEStack_5c0 = (EventLoop *)local_3c8._24_8_;
      local_5d0._0_8_ = local_3c8._0_8_;
    }
    pEStack_5b8._4_4_ = (undefined4)((ulong)pEStack_5b8 >> 0x20);
    pEStack_5b8 = (EventLoop *)CONCAT44(pEStack_5b8._4_4_,local_3c8._40_4_);
    local_5e8 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d0,(void *)0x0,0);
    __flags = 0x4c9974;
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
               (char (*) [4])0x502717,(Reader *)&local_5e8);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)local_5d0,
             &local_4d8);
  reader._reader.capTable = (CapTableReader *)local_5d0._8_8_;
  reader._reader.segment = (SegmentReader *)local_5d0._0_8_;
  reader._reader.data = pEStack_5c0;
  reader._reader.pointers = (WirePointer *)pEStack_5b8;
  reader._reader._32_8_ = pEStack_5b0;
  reader._reader._40_8_ = local_5a8;
  checkTestMessage(reader);
  if ((local_5f0 != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_5e8.ptr._0_4_ = 3;
    __flags = 0x4c99d9;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xbf,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)&local_5e8,&local_5f0);
  }
  if ((local_5ec != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_5e8.ptr._0_4_ = 1;
    __flags = 0x4fe09f;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xc0,ERROR,
               "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
               (char (*) [43])"failed: expected (1) == (reverseCallCount)",(int *)&local_5e8,
               &local_5ec);
  }
  plVar1 = local_598;
  if (local_598 != (long *)0x0) {
    local_598 = (long *)0x0;
    (**local_5a0->_vptr_RequestHook)(local_5a0,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  uVar2 = local_3c8._56_8_;
  if ((Disposer *)local_3c8._56_8_ != (Disposer *)0x0) {
    local_3c8._56_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_3c8._48_8_)(local_3c8._48_8_,(*(_func_int ***)uVar2)[-2] + uVar2);
  }
  pDVar22 = local_4d8.hook.disposer;
  uVar2 = local_4d8.super_Builder._builder._32_8_;
  if (local_4d8.super_Builder._builder._32_8_ != 0) {
    local_4d8.super_Builder._builder.dataSize = 0;
    local_4d8.super_Builder._builder.pointerCount = 0;
    local_4d8.super_Builder._builder._38_2_ = 0;
    local_4d8.hook.disposer = (Disposer *)0x0;
    (**(local_4d8.hook.ptr)->_vptr_RequestHook)(local_4d8.hook.ptr,uVar2,8,pDVar22,pDVar22,0);
    __flags = (int)pDVar22;
  }
  pWVar7 = local_4d8.super_Builder._builder.pointers;
  if (local_4d8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_4d8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (**((BootstrapFactoryBase *)local_4d8.super_Builder._builder.data)->_vptr_BootstrapFactoryBase)
              (local_4d8.super_Builder._builder.data,
               (long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
  }
  pCVar6 = local_4d8.super_Builder._builder.capTable;
  if (local_4d8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_4d8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)((local_4d8.super_Builder._builder.segment)->super_SegmentReader).arena)
              (local_4d8.super_Builder._builder.segment,
               (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar6->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar3 = local_470;
  if (local_470 != (RequestHook *)0x0) {
    local_470 = (RequestHook *)0x0;
    (**local_478->_vptr_Disposer)
              (local_478,pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pDVar22 = local_558.hook.disposer;
  uVar2 = local_558.super_Builder._builder._32_8_;
  if (local_558.super_Builder._builder._32_8_ != 0) {
    local_558.super_Builder._builder.dataSize = 0;
    local_558.super_Builder._builder.pointerCount = 0;
    local_558.super_Builder._builder._38_2_ = 0;
    local_558.hook.disposer = (Disposer *)0x0;
    (**(local_558.hook.ptr)->_vptr_RequestHook)(local_558.hook.ptr,uVar2,8,pDVar22,pDVar22,0);
    __flags = (int)pDVar22;
  }
  pWVar7 = local_558.super_Builder._builder.pointers;
  if (local_558.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_558.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_558.super_Builder._builder.data)
              (local_558.super_Builder._builder.data,
               (long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
  }
  pCVar6 = local_558.super_Builder._builder.capTable;
  if (local_558.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_558.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_558.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_558.super_Builder._builder.segment,
      (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] + (long)&pCVar6->super_CapTableReader)
    ;
  }
  pRVar3 = local_438;
  if (local_438 != (RequestHook *)0x0) {
    local_438 = (RequestHook *)0x0;
    (**local_440->_vptr_Disposer)
              (local_440,pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pDVar22 = pDStack_568;
  pPVar4 = local_570;
  if (local_570 != (PipelineOp *)0x0) {
    local_570 = (PipelineOp *)0x0;
    pDStack_568 = (Disposer *)0x0;
    (**local_560->_vptr_ArrayDisposer)(local_560,pPVar4,8,pDVar22,pDVar22,0);
    __flags = (int)pDVar22;
  }
  uVar2 = local_590._24_8_;
  if ((WirePointer *)local_590._24_8_ != (WirePointer *)0x0) {
    local_590._24_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_590._16_8_)
              (local_590._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar2)->value +
               *(long *)((long)*(WirePointer *)uVar2 + -0x10));
  }
  uVar2 = local_590._8_8_;
  if ((EventLoop *)local_590._8_8_ != (EventLoop *)0x0) {
    local_590._8_8_ = (EventLoop *)0x0;
    (*(code *)((SegmentReader *)local_590._0_8_)->arena->_vptr_Arena)
              (local_590._0_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
  }
  pAVar5 = local_510.ops.disposer;
  if (local_510.ops.disposer != (ArrayDisposer *)0x0) {
    local_510.ops.disposer = (ArrayDisposer *)0x0;
    (***(_func_int ***)local_510.ops.size_)
              (local_510.ops.size_,
               pAVar5->_vptr_ArrayDisposer[-2] + (long)&pAVar5->_vptr_ArrayDisposer);
  }
  if ((local_5f1 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    __flags = 0x4fe0f0;
    kj::_::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xc3,ERROR,"\"failed: expected \" \"!(disconnected)\"",
               (char (*) [33])"failed: expected !(disconnected)");
  }
  (*((local_418.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
  local_3c8[0x160] = '\0';
  kj::_::waitImpl(&local_4e8,(ExceptionOrValue *)local_3c8,local_3d8);
  if (local_3c8[0x160] == '\x01') {
    if (local_3c8[0] != false) {
      kj::throwRecoverableException((Exception *)(local_3c8 + 8),0);
    }
  }
  else {
    if (local_3c8[0] == false) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException((Exception *)(local_3c8 + 8),0);
  }
  if (local_3c8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_3c8 + 8));
  }
  local_210.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_5d0,(Client *)local_430,&local_210);
  *(undefined4 *)&pEStack_5c0->port = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_590,&local_5ec);
  pEVar16 = (EventLoop *)local_590._8_8_;
  local_3c8._0_8_ = local_590._0_8_;
  local_3c8._8_8_ = local_590._8_8_ + 0x10;
  if ((EventLoop *)local_590._8_8_ == (EventLoop *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
  }
  local_590._8_8_ = (PromiseNode *)0x0;
  OVar24 = Capability::Client::makeLocalClient
                     ((Client *)(local_520 + 8),(Own<capnp::Capability::Server> *)local_3c8);
  uVar2 = local_3c8._8_8_;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(Event **)uVar2)[-1].prev),OVar24.ptr);
  }
  local_520._0_8_ = &Capability::Client::typeinfo;
  local_3c8._0_8_ = local_5d0._0_8_;
  local_3c8._8_8_ = local_5d0._8_8_;
  local_3c8._16_8_ = pEStack_5b8;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_3c8,(Own<capnp::ClientHook> *)(local_520 + 8));
  pDVar22 = local_510.hook.disposer;
  pvVar19 = extraout_RDX_11;
  if (local_510.hook.disposer != (Disposer *)0x0) {
    local_510.hook.disposer = (Disposer *)0x0;
    (**((BootstrapFactoryBase *)local_520._8_8_)->_vptr_BootstrapFactoryBase)
              (local_520._8_8_,pDVar22->_vptr_Disposer[-2] + (long)&pDVar22->_vptr_Disposer);
    pvVar19 = extraout_RDX_12;
  }
  uVar2 = local_590._8_8_;
  if ((PromiseNode *)local_590._8_8_ != (PromiseNode *)0x0) {
    local_590._8_8_ = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)local_590._0_8_)->arena->_vptr_Arena)
              (local_590._0_8_,
               ((CapTableReader *)uVar2)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar2);
    pvVar19 = extraout_RDX_13;
  }
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)local_520,(int)local_5d0,pvVar19,(size_t)pEVar16,__flags);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,&local_510,1);
  local_468._0_8_ = local_3c8._0_8_;
  local_468._8_8_ = local_3c8._8_8_;
  local_468._16_8_ = local_3c8._16_8_;
  local_468._24_8_ = local_3c8._24_8_;
  pEStack_448 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_558,(Pipeline *)local_468);
  local_228.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_590,(Client *)&local_558,&local_228);
  pvVar19 = local_558.super_Builder._builder.data;
  pvVar20 = extraout_RDX_14;
  if ((long *)local_558.super_Builder._builder.data != (long *)0x0) {
    local_558.super_Builder._builder.data = (long *)0x0;
    (**((local_558.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_558.super_Builder._builder.capTable,(long)pvVar19 + *(long *)(*pvVar19 + -0x10)
              );
    pvVar20 = extraout_RDX_15;
  }
  pEVar18 = (EventLoop *)local_468._24_8_;
  uVar2 = local_468._16_8_;
  if ((WirePointer *)local_468._16_8_ != (WirePointer *)0x0) {
    local_468._16_8_ = (WirePointer *)0x0;
    local_468._24_8_ = (EventLoop *)0x0;
    pEVar16 = pEVar18;
    (**pEStack_448->_vptr_Event)(pEStack_448,uVar2,8,pEVar18,pEVar18,0);
    __flags = (int)pEVar16;
    pEVar16 = pEVar18;
    pvVar20 = extraout_RDX_16;
  }
  uVar2 = local_468._8_8_;
  if ((Impl *)local_468._8_8_ != (Impl *)0x0) {
    local_468._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_468._0_8_)->arena->_vptr_Arena)
              (local_468._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar20 = extraout_RDX_17;
  }
  *(undefined4 *)(_func_int ***)local_590._16_8_ = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_468,(int)local_590,pvVar20,(size_t)pEVar16,__flags);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,&local_510,1);
  local_4a0._0_8_ = local_3c8._0_8_;
  local_4a0._8_8_ = local_3c8._8_8_;
  local_4a0._16_8_ = local_3c8._16_8_;
  local_4a0._24_8_ = local_3c8._24_8_;
  pEStack_480 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_5e8,(Pipeline *)local_4a0);
  (**(code **)(**(long **)((long)&local_5e8.size_ + *(long *)(local_5e8.ptr + -0x18)) + 0x20))
            (local_3c8);
  local_4d8.super_Builder._builder.capTable = (CapTableBuilder *)local_3c8._0_8_;
  local_4d8.super_Builder._builder.data = (void *)local_3c8._8_8_;
  local_4d8.super_Builder._builder.segment =
       (SegmentBuilder *)&capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_240.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)&local_558,(Client *)&local_4d8,&local_240);
  pvVar19 = local_4d8.super_Builder._builder.data;
  pvVar20 = extraout_RDX_18;
  if ((Impl *)local_4d8.super_Builder._builder.data != (Impl *)0x0) {
    local_4d8.super_Builder._builder.data = (Impl *)0x0;
    (**((local_4d8.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_4d8.super_Builder._builder.capTable,
               ((BootstrapFactoryBase *)pvVar19)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)pvVar19);
    pvVar20 = extraout_RDX_19;
  }
  plVar1 = local_5d8;
  if (local_5d8 != (long *)0x0) {
    local_5d8 = (long *)0x0;
    (*(code *)**(undefined8 **)local_5e8.size_)
              (local_5e8.size_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    pvVar20 = extraout_RDX_20;
  }
  pEVar18 = (EventLoop *)local_4a0._24_8_;
  uVar2 = local_4a0._16_8_;
  if ((WirePointer *)local_4a0._16_8_ != (WirePointer *)0x0) {
    local_4a0._16_8_ = (WirePointer *)0x0;
    local_4a0._24_8_ = (EventLoop *)0x0;
    pEVar16 = pEVar18;
    (**pEStack_480->_vptr_Event)(pEStack_480,uVar2,8,pEVar18,pEVar18,0);
    __flags = (int)pEVar16;
    pEVar16 = pEVar18;
    pvVar20 = extraout_RDX_21;
  }
  uVar2 = local_4a0._8_8_;
  if ((Impl *)local_4a0._8_8_ != (Impl *)0x0) {
    local_4a0._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_4a0._0_8_)->arena->_vptr_Arena)
              (local_4a0._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar20 = extraout_RDX_22;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_4a0,(int)&local_558,pvVar20,(size_t)pEVar16,__flags);
  local_4d8.super_Builder._builder.segment = (SegmentBuilder *)&PTR_run_006349a8;
  local_4d8.super_Builder._builder.capTable = (CapTableBuilder *)local_468;
  local_4d8.super_Builder._builder.data = &local_3f8;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_3c8,(Runnable *)&local_4d8);
  if (local_3c8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_3c8 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[110]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr\""
               ,(char (*) [110])
                "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr"
              );
  }
  local_4d8.super_Builder._builder.segment = (SegmentBuilder *)&PTR_run_006349d8;
  local_4d8.super_Builder._builder.capTable = (CapTableBuilder *)local_4a0;
  local_4d8.super_Builder._builder.data = &local_3f8;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_3c8,(Runnable *)&local_4d8);
  if (local_3c8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_3c8 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[111]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr\""
               ,(char (*) [111])
                "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr"
              );
  }
  if ((local_5f0 != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_3c8._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xde,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)local_3c8,&local_5f0);
  }
  if ((local_5ec != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_3c8._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
               (char (*) [43])"failed: expected (1) == (reverseCallCount)",(int *)local_3c8,
               &local_5ec);
  }
  pDVar22 = local_478;
  pEVar11 = pEStack_480;
  if (pEStack_480 != (Event *)0x0) {
    pEStack_480 = (Event *)0x0;
    local_478 = (Disposer *)0x0;
    (**local_470->_vptr_RequestHook)(local_470,pEVar11,8,pDVar22,pDVar22,0);
  }
  uVar2 = local_4a0._24_8_;
  if ((EventLoop *)local_4a0._24_8_ != (EventLoop *)0x0) {
    local_4a0._24_8_ = (EventLoop *)0x0;
    (**(code **)*(WirePointer *)local_4a0._16_8_)
              (local_4a0._16_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
  }
  uVar2 = local_4a0._8_8_;
  if ((Impl *)local_4a0._8_8_ != (Impl *)0x0) {
    local_4a0._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_4a0._0_8_)->arena->_vptr_Arena)
              (local_4a0._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  pRVar3 = local_558.hook.ptr;
  if (local_558.hook.ptr != (RequestHook *)0x0) {
    local_558.hook.ptr = (RequestHook *)0x0;
    (**(local_558.hook.disposer)->_vptr_Disposer)
              (local_558.hook.disposer,
               pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pDVar22 = local_440;
  pEVar11 = pEStack_448;
  if (pEStack_448 != (Event *)0x0) {
    pEStack_448 = (Event *)0x0;
    local_440 = (Disposer *)0x0;
    (**local_438->_vptr_RequestHook)(local_438,pEVar11,8,pDVar22,pDVar22,0);
  }
  uVar2 = local_468._24_8_;
  if ((EventLoop *)local_468._24_8_ != (EventLoop *)0x0) {
    local_468._24_8_ = (EventLoop *)0x0;
    (**(code **)*(WirePointer *)local_468._16_8_)
              (local_468._16_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
  }
  uVar2 = local_468._8_8_;
  if ((Impl *)local_468._8_8_ != (Impl *)0x0) {
    local_468._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_468._0_8_)->arena->_vptr_Arena)
              (local_468._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  pAVar5 = local_560;
  if (local_560 != (ArrayDisposer *)0x0) {
    local_560 = (ArrayDisposer *)0x0;
    (**pDStack_568->_vptr_Disposer)
              (pDStack_568,pAVar5->_vptr_ArrayDisposer[-2] + (long)&pAVar5->_vptr_ArrayDisposer);
  }
  sVar9 = local_510.ops.size_;
  pPVar4 = local_510.ops.ptr;
  if (local_510.ops.ptr != (PipelineOp *)0x0) {
    local_510.ops.ptr = (PipelineOp *)0x0;
    local_510.ops.size_ = 0;
    (**(local_510.ops.disposer)->_vptr_ArrayDisposer)(local_510.ops.disposer,pPVar4,8,sVar9,sVar9,0)
    ;
  }
  pPVar8 = local_510.hook.ptr;
  if ((WirePointer *)local_510.hook.ptr != (WirePointer *)0x0) {
    local_510.hook.ptr = (PipelineHook *)0x0;
    (**(local_510.hook.disposer)->_vptr_Disposer)
              (local_510.hook.disposer,
               (long)&((WireValue<uint32_t>_conflict *)&pPVar8->_vptr_PipelineHook)->value +
               *(long *)((long)*(WirePointer *)pPVar8 + -0x10));
  }
  uVar2 = local_520._8_8_;
  if ((Impl *)local_520._8_8_ != (Impl *)0x0) {
    local_520._8_8_ = (Impl *)0x0;
    (**(code **)((SegmentReader *)local_520._0_8_)->arena)
              (local_520._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  pRVar3 = local_5a0;
  if (local_5a0 != (RequestHook *)0x0) {
    local_5a0 = (RequestHook *)0x0;
    (**local_5a8->_vptr_Disposer)
              (local_5a8,pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pSVar12 = pSStack_420;
  if (pSStack_420 != (Server *)0x0) {
    pSStack_420 = (Server *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_430._12_4_,local_430._8_4_))
              ((undefined8 *)CONCAT44(local_430._12_4_,local_430._8_4_),
               pSVar12->_vptr_Server[-2] + (long)&pSVar12->_vptr_Server);
  }
  pPVar10 = local_4e8.ptr;
  if ((TransformPromiseNodeBase *)local_4e8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_4e8.ptr = (PromiseNode *)0x0;
    (**(local_4e8.disposer)->_vptr_Disposer)
              (local_4e8.disposer,
               ((PromiseNode *)&pPVar10->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar10->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  RpcSystemBase::~RpcSystemBase(&local_258);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_1b0);
  pAVar13 = local_418.pipe.ptr;
  if (local_418.pipe.ptr != (AsyncIoStream *)0x0) {
    local_418.pipe.ptr = (AsyncIoStream *)0x0;
    (**(local_418.pipe.disposer)->_vptr_Disposer)
              (local_418.pipe.disposer,
               (pAVar13->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar13->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  if (local_418.thread.ptr != (Thread *)0x0) {
    local_418.thread.ptr = (Thread *)0x0;
    (**(local_418.thread.disposer)->_vptr_Disposer)();
  }
  pAVar14 = local_3e0;
  if (local_3e0 != (AsyncIoProvider *)0x0) {
    local_3e0 = (AsyncIoProvider *)0x0;
    (**(code **)*local_3e8)
              (local_3e8,pAVar14->_vptr_AsyncIoProvider[-2] + (long)&pAVar14->_vptr_AsyncIoProvider)
    ;
  }
  plVar1 = local_3f0;
  if (local_3f0 != (long *)0x0) {
    local_3f0 = (long *)0x0;
    (**(code **)*local_3f8)(local_3f8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, Pipelining) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;
  int reverseCallCount = 0;  // Calls back from server to client.

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  bool disconnected = false;
  kj::Promise<void> disconnectPromise = network.onDisconnect().then([&]() { disconnected = true; });

  {
    // Request the particular capability from the server.
    auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
        test::TestSturdyRefObjectId::Tag::TEST_PIPELINE).castAs<test::TestPipeline>();

    {
      // Use the capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      promise = nullptr;  // Just to be annoying, drop the original promise.

      EXPECT_EQ(0, callCount);
      EXPECT_EQ(0, reverseCallCount);

      auto response = pipelinePromise.wait(ioContext.waitScope);
      EXPECT_EQ("bar", response.getX());

      auto response2 = pipelinePromise2.wait(ioContext.waitScope);
      checkTestMessage(response2);

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }

    EXPECT_FALSE(disconnected);

    // What if we disconnect?
    serverThread.pipe->shutdownWrite();

    // The other side should also disconnect.
    disconnectPromise.wait(ioContext.waitScope);

    {
      // Use the now-broken capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      EXPECT_ANY_THROW(pipelinePromise.wait(ioContext.waitScope));
      EXPECT_ANY_THROW(pipelinePromise2.wait(ioContext.waitScope));

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }
  }
}